

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall
Fl_Text_Buffer::findchar_forward(Fl_Text_Buffer *this,int startPos,uint searchChar,int *foundPos)

{
  int iVar1;
  uint uVar2;
  int pos;
  int iVar3;
  
  iVar1 = this->mLength;
  iVar3 = 0;
  pos = iVar1;
  if (startPos < iVar1) {
    if (startPos < 1) {
      startPos = 0;
    }
    iVar3 = 1;
    pos = startPos;
    while (pos < iVar1) {
      uVar2 = char_at(this,pos);
      if (uVar2 == searchChar) goto LAB_001cbe6a;
      pos = next_char(this,pos);
      iVar1 = this->mLength;
    }
    iVar3 = 0;
    pos = iVar1;
  }
LAB_001cbe6a:
  *foundPos = pos;
  return iVar3;
}

Assistant:

int Fl_Text_Buffer::findchar_forward(int startPos, unsigned searchChar,
				     int *foundPos) const 
{
  if (startPos >= mLength) {
    *foundPos = mLength;
    return 0;
  }
  
  if (startPos<0)
    startPos = 0;
  
  for ( ; startPos<mLength; startPos = next_char(startPos)) {
    if (searchChar == char_at(startPos)) {
      *foundPos = startPos;
      return 1;
    }
  }
  
  *foundPos = mLength;
  return 0;
}